

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O0

void nsync::nsync_mu_semaphore_p(nsync_semaphore *s)

{
  uint o;
  int iVar1;
  int *piVar2;
  bool bVar3;
  int futex_result;
  int i;
  futex *f;
  nsync_semaphore *s_local;
  
  do {
    o = std::atomic_load_explicit<unsigned_int>((atomic<unsigned_int> *)s,memory_order_relaxed);
    if ((((o == 0) && (iVar1 = futex((int *)s,0x189,0,(timespec *)0x0,(int *)0x0,-1), iVar1 != 0))
        && (piVar2 = __errno_location(), *piVar2 != 4)) &&
       (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      uRam0000000000000000 = 0;
    }
    bVar3 = true;
    if (o != 0) {
      iVar1 = atm_cas_acq_u32_((nsync_atomic_uint32_ *)s,o,o - 1);
      bVar3 = iVar1 == 0;
    }
  } while (bVar3);
  return;
}

Assistant:

void nsync_mu_semaphore_p (nsync_semaphore *s) {
	struct futex *f = (struct futex *) s;
	int i;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
                        int futex_result = futex (&f->i, FUTEX_WAIT_, i, NULL,
                                                  NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR ||
				errno == EWOULDBLOCK);
		}
	} while (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i-1));
}